

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mulut.h
# Opt level: O1

void __thiscall MulutTertawa::MulutTertawa(MulutTertawa *this)

{
  void *local_90 [4];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  Polygon::Polygon(&this->super_Polygon);
  local_28 = 0x406a400000000000;
  local_20 = 0x407f400000000000;
  local_18 = 0;
  local_40 = 0x406e000000000000;
  local_38 = 0x4080400000000000;
  local_30 = 0;
  local_58 = 0x4072c00000000000;
  local_50 = 0x4080400000000000;
  local_48 = 0;
  local_70 = 0x4074a00000000000;
  local_68 = 0x407f400000000000;
  local_60 = 0;
  curve::curve((curve *)local_90);
  Polygon::addCurve(this,local_90);
  if (local_90[0] != (void *)0x0) {
    operator_delete(local_90[0]);
  }
  Polygon::setColor((int)this,0xa0,0x52,0x2d);
  return;
}

Assistant:

MulutTertawa() {
    //baw
    addCurve(curve(Point<double>(210, 500), Point<double>(240, 520), Point<double>(300, 520), Point<double>(330, 500)));
    //addCurve(curve(Point<double>(330, 500), Point<double>(300, 515), Point<double>(240, 515), Point<double>(210, 500)));
    setColor(160,82,45,0);
  }